

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O3

size_t __thiscall duckdb_re2::DFA::StateHash::operator()(StateHash *this,State *a)

{
  long lVar1;
  long lVar2;
  
  lVar1 = (ulong)a->flag_ + 0x53;
  if (0 < (long)a->ninst_) {
    lVar2 = 0;
    do {
      lVar1 = ((ulong)(lVar1 * -0x23c146b50754b36d) >> 0x2d | lVar1 * -0x35a83aa59b680000) +
              (long)a->inst_[lVar2];
      lVar2 = lVar2 + 1;
    } while (a->ninst_ != lVar2);
  }
  return (ulong)(lVar1 * -0x23c146b50754b36d) >> 0x2d | lVar1 * -0x35a83aa59b680000;
}

Assistant:

size_t operator()(const State* a) const {
      DCHECK(a != NULL);
      HashMix mix(a->flag_);
      for (int i = 0; i < a->ninst_; i++)
        mix.Mix(a->inst_[i]);
      mix.Mix(0);
      return mix.get();
    }